

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.cpp
# Opt level: O0

void __thiscall Program::show_list(Program *this)

{
  ostream *poVar1;
  undefined1 local_38 [44];
  int num;
  Program *this_local;
  
  unique0x1000009b = this;
  for (local_38._36_4_ = getFirstLineNumber(this); local_38._36_4_ != this->end_line;
      local_38._36_4_ = getNextLineNumber(this,local_38._36_4_)) {
    getSourceLine_abi_cxx11_((Program *)local_38,(int)this);
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)local_38);
    std::operator<<(poVar1,'\n');
    std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

void Program::show_list() {
    int num = getFirstLineNumber();
    while (num != end_line) {
        cout << getSourceLine(num) << '\n';
        num = getNextLineNumber(num);
    }
}